

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_AngleValue *
ON_AngleValue::Create
          (ON_AngleValue *__return_storage_ptr__,double angle_value,
          AngleUnitSystem angle_unit_system,uint locale_id,StringFormat string_format)

{
  double dVar1;
  bool bVar2;
  wchar_t *pwVar3;
  undefined7 in_register_00000031;
  double denominator;
  double numerator;
  ON_AngleValue rc;
  ON_AngleUnitName name;
  double sign;
  double local_30;
  double proper;
  
  ON_AngleValue(&rc);
  if ((int)CONCAT71(in_register_00000031,angle_unit_system) == 0xff || NAN(angle_value)) {
    ON_AngleValue(__return_storage_ptr__,&Unset);
    goto LAB_005c9fbc;
  }
  rc.m_angle_unit_system = angle_unit_system;
  rc.m_angle = angle_value;
  name = ON_AngleUnitName::Create(locale_id,angle_unit_system,1.0 < angle_value);
  sign = ON_DBL_QNAN;
  proper = ON_DBL_QNAN;
  numerator = ON_DBL_QNAN;
  denominator = ON_DBL_QNAN;
  if ((string_format - ExactFraction & 0xfd) == 0) {
    bVar2 = ON_IsAnnotationFractionNumber(rc.m_angle,true,&sign,&proper,&numerator,&denominator);
    if (!bVar2) goto LAB_005c9f46;
    rc.m_angle = (sign * numerator) / denominator;
    bVar2 = ON_AngleUnitName::AngleUnitNameIsNotEmpty(&name);
    dVar1 = numerator;
    if (bVar2) {
      local_30 = denominator;
      pwVar3 = ON_AngleUnitName::AngleUnitName(&name);
      ON_wString::Format(&rc.m_angle_as_string,L"%0.17g/%0.17g %ls",dVar1,local_30,pwVar3);
    }
    else {
      ON_wString::Format(&rc.m_angle_as_string,L"%0.17g/%0.17g",numerator,denominator);
    }
  }
  else {
LAB_005c9f46:
    bVar2 = ON_AngleUnitName::AngleUnitNameIsNotEmpty(&name);
    dVar1 = rc.m_angle;
    if (bVar2) {
      pwVar3 = ON_AngleUnitName::AngleUnitName(&name);
      ON_wString::Format(&rc.m_angle_as_string,L"%0.17g %ls",dVar1,pwVar3);
    }
    else {
      ON_wString::Format(&rc.m_angle_as_string,L"%0.17g",rc.m_angle);
    }
  }
  rc.m_context_length_unit_system = None;
  rc.m_context_locale_id = ON_AngleUnitName::LocaleId(&name);
  ON_AngleValue(__return_storage_ptr__,&rc);
LAB_005c9fbc:
  ON_wString::~ON_wString(&rc.m_angle_as_string);
  return __return_storage_ptr__;
}

Assistant:

ON_AngleValue ON_AngleValue::Create(
  double angle_value,
  ON::AngleUnitSystem angle_unit_system,
  unsigned int locale_id,
  ON_AngleValue::StringFormat string_format
)
{
  ON_AngleValue rc;
  for (;;)
  {
    bool bFraction = false;
    bool bClean = false;
    switch (string_format)
    {
    case ON_AngleValue::StringFormat::ExactDecimal:
      break;
    case ON_AngleValue::StringFormat::ExactFraction:
      bFraction = true;
      break;
    case ON_AngleValue::StringFormat::CleanDecimal:
      bClean = true;
      break;
    case ON_AngleValue::StringFormat::CleanFraction:
      bClean = true;
      bFraction = true;
      break;
    default:
      string_format = ON_AngleValue::StringFormat::ExactDecimal;
      break;
    }

    if (false == (angle_value == angle_value))
      break;
    if (ON::AngleUnitSystem::Unset == angle_unit_system)
      break;
    rc.m_angle = angle_value;
    rc.m_angle_unit_system = angle_unit_system;
    const ON_AngleUnitName name = ON_AngleUnitName::Create(locale_id, angle_unit_system, angle_value > 1.0);

    // DO NOT USE A "PRETTY" FORMAT!
    // It is critical that this string scan back to rc.m_angle exactly.
    double sign = ON_DBL_QNAN;
    double proper = ON_DBL_QNAN;
    double numerator = ON_DBL_QNAN;
    double denominator = ON_DBL_QNAN;
    if (
      bFraction 
      && ON_IsAnnotationFractionNumber(rc.m_angle, true, &sign, &proper, &numerator, &denominator)
      )
    {
      rc.m_angle = sign*numerator/denominator;
      if (name.AngleUnitNameIsNotEmpty() )
        rc.m_angle_as_string.Format(L"%0.17g/%0.17g %ls", numerator, denominator, name.AngleUnitName());
      else
        rc.m_angle_as_string.Format(L"%0.17g/%0.17g", numerator, denominator);
    }
    else
    {
      if (name.AngleUnitNameIsNotEmpty())
        rc.m_angle_as_string.Format(L"%0.17g %ls", rc.m_angle, name.AngleUnitName());
      else
        rc.m_angle_as_string.Format(L"%0.17g", rc.m_angle);
    }

    rc.m_context_length_unit_system = ON::LengthUnitSystem::None;
    rc.m_context_locale_id = name.LocaleId();

    return rc;
  }
  return ON_AngleValue::Unset;
}